

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O1

mz_bool mz_zip_writer_add_mem_ex
                  (mz_zip_archive *pZip,char *pArchive_name,void *pBuf,size_t buf_size,
                  void *pComment,mz_uint16 comment_size,mz_uint level_and_flags,
                  mz_uint64 uncomp_size,mz_uint32 uncomp_crc32)

{
  long lVar1;
  char cVar2;
  mz_uint mVar3;
  mz_zip_internal_state *pArray;
  mz_uint16 method;
  mz_uint16 mVar4;
  tdefl_compressor *d;
  size_t sVar5;
  undefined1 uVar6;
  mz_bool mVar7;
  tdefl_status tVar8;
  char *pcVar9;
  size_t sVar10;
  void *pvVar11;
  ulong min_new_capacity;
  ulong uVar12;
  uint uVar13;
  mz_uint64 mVar14;
  byte bVar15;
  uint uVar16;
  mz_uint64 mVar17;
  uint uVar18;
  undefined8 uVar19;
  mz_uint16 dos_date_00;
  undefined7 in_stack_ffffffffffffff18;
  void *pvVar20;
  void *pvVar21;
  mz_uint16 dos_date;
  mz_uint16 dos_time;
  mz_uint64 local_d0;
  tdefl_compressor *local_c8;
  size_t local_c0;
  ulong local_b8;
  char *local_b0;
  mz_ulong local_a8;
  mz_uint8 *local_a0;
  void *local_98;
  mz_uint64 local_90;
  time_t cur_time;
  undefined1 uStack_80;
  undefined1 uStack_7f;
  undefined1 uStack_7e;
  undefined1 uStack_7d;
  undefined1 uStack_7c;
  undefined1 uStack_7b;
  undefined1 uStack_7a;
  undefined1 uStack_79;
  undefined1 uStack_78;
  undefined1 uStack_77;
  undefined1 uStack_76;
  undefined1 uStack_75;
  undefined1 uStack_74;
  undefined1 uStack_73;
  ulong uStack_72;
  undefined8 local_68;
  ulong local_60;
  void *local_58;
  mz_zip_writer_add_state state;
  void *local_38;
  
  dos_time = 0;
  dos_date = 0;
  uVar16 = 6;
  if (-1 < (int)level_and_flags) {
    uVar16 = level_and_flags;
  }
  uVar18 = uVar16 & 0xf;
  pArray = pZip->m_pState;
  if (pArray == (mz_zip_internal_state *)0x0) {
    return 0;
  }
  if (pZip->m_zip_mode != MZ_ZIP_MODE_WRITING) {
    return 0;
  }
  if (pArchive_name == (char *)0x0) {
    return 0;
  }
  if (pBuf == (void *)0x0 && buf_size != 0) {
    return 0;
  }
  if (pComment == (void *)0x0 && comment_size != 0) {
    return 0;
  }
  if (10 < uVar18) {
    return 0;
  }
  if (pZip->m_total_files == 0xffff) {
    return 0;
  }
  uVar16 = uVar16 & 0x400;
  local_98 = (void *)uncomp_size;
  local_b8 = uncomp_size | buf_size;
  if (local_b8 >> 0x20 != 0) {
    return 0;
  }
  if (uncomp_size != 0 && uVar16 == 0) {
    return 0;
  }
  if (*pArchive_name == '/') {
    return 0;
  }
  local_a8 = (mz_ulong)uncomp_crc32;
  local_90 = pZip->m_archive_size;
  bVar15 = uVar18 == 0 | (byte)(uVar16 >> 10);
  for (pcVar9 = pArchive_name; cVar2 = *pcVar9, cVar2 != '\0'; pcVar9 = pcVar9 + 1) {
    if (cVar2 == ':') {
      return 0;
    }
    if (cVar2 == '\\') {
      return 0;
    }
  }
  local_b0 = pArchive_name;
  local_a0 = (mz_uint8 *)pBuf;
  local_58 = pComment;
  time(&cur_time);
  (anonymous_namespace)::miniz::mz_zip_time_to_dos_time(cur_time,&dos_time,&dos_date);
  local_c0 = strlen(local_b0);
  if (0xffff < local_c0) {
    return 0;
  }
  mVar3 = pZip->m_file_offset_alignment;
  if (mVar3 == 0) {
    uVar13 = 0;
  }
  else {
    uVar13 = mVar3 - ((uint)pZip->m_archive_size & mVar3 - 1) & mVar3 - 1;
  }
  uVar12 = (ulong)uVar13;
  if (pZip->m_total_files == 0xffff) {
    return 0;
  }
  local_60 = (ulong)comment_size;
  if (pZip->m_archive_size + local_60 + local_c0 + uVar12 + 0x4c >> 0x20 != 0) {
    return 0;
  }
  uVar19 = 0;
  if ((local_c0 != 0) && (local_b0[local_c0 - 1] == '/')) {
    if (local_b8 != 0) {
      return 0;
    }
    uVar19 = 0x10;
  }
  min_new_capacity = (pArray->m_central_dir).m_size + local_60 + local_c0 + 0x2e;
  local_b8 = uVar12;
  if ((((pArray->m_central_dir).m_capacity < min_new_capacity) &&
      (mVar7 = (anonymous_namespace)::miniz::mz_zip_array_ensure_capacity
                         (pZip,&pArray->m_central_dir,min_new_capacity,1), mVar7 == 0)) ||
     ((uVar12 = (pArray->m_central_dir_offsets).m_size + 1, local_68 = uVar19,
      (pArray->m_central_dir_offsets).m_capacity < uVar12 &&
      (mVar7 = (anonymous_namespace)::miniz::mz_zip_array_ensure_capacity
                         (pZip,&pArray->m_central_dir_offsets,uVar12,1), mVar7 == 0)))) {
    return 0;
  }
  if ((void *)buf_size == (void *)0x0 || bVar15 != 0) {
    local_c8 = (tdefl_compressor *)0x0;
  }
  else {
    local_c8 = (tdefl_compressor *)(*pZip->m_pAlloc)(pZip->m_pAlloc_opaque,1,0x4df78);
    if (local_c8 == (tdefl_compressor *)0x0) {
      return 0;
    }
  }
  mVar17 = local_90;
  lVar1 = local_b8 + 0x1e;
  mVar7 = (anonymous_namespace)::miniz::mz_zip_writer_write_zeros(pZip,local_90,(mz_uint32)lVar1);
  sVar5 = local_c0;
  if (mVar7 != 0) {
    local_d0 = lVar1 + mVar17;
    uStack_78 = 0;
    uStack_77 = 0;
    uStack_76 = 0;
    uStack_75 = 0;
    uStack_74 = 0;
    uStack_73 = 0;
    uStack_72 = 0;
    cur_time = 0;
    uStack_80 = 0;
    uStack_7f = 0;
    uStack_7e = 0;
    uStack_7d = 0;
    uStack_7c = 0;
    uStack_7b = 0;
    uStack_7a = 0;
    uStack_79 = 0;
    sVar10 = (*pZip->m_pWrite)(pZip->m_pIO_opaque,local_d0,local_b0,local_c0);
    if (sVar10 == sVar5) {
      pvVar20 = (void *)buf_size;
      if (uVar16 == 0) {
        local_a8 = mz_crc32(0,local_a0,buf_size);
        if (buf_size < (void *)0x4) {
          uVar18 = 0;
        }
        bVar15 = bVar15 | buf_size < (void *)0x4;
        local_98 = (void *)buf_size;
      }
      d = local_c8;
      local_d0 = local_d0 + local_c0;
      if (bVar15 == 0) {
        if (pvVar20 == (void *)0x0) {
          mVar17 = 0;
          pvVar21 = (void *)0x0;
        }
        else {
          state.m_comp_size = 0;
          uVar12 = 10;
          if (uVar18 < 10) {
            uVar12 = (ulong)uVar18;
          }
          uVar13 = (uint)(uVar18 < 4) << 0xe |
                   tdefl_write_image_to_png_file_in_memory_ex::s_tdefl_png_num_probes[uVar12];
          uVar16 = uVar13 | 0x80000;
          if (uVar18 != 0) {
            uVar16 = uVar13;
          }
          state.m_pZip = pZip;
          state.m_cur_archive_file_ofs = local_d0;
          tdefl_init(local_c8,(anonymous_namespace)::miniz::mz_zip_writer_add_put_buf_callback,
                     &state,uVar16);
          local_38 = pvVar20;
          tVar8 = tdefl_compress(d,local_a0,(size_t *)&local_38,(void *)0x0,(size_t *)0x0,
                                 TDEFL_FINISH);
          if (tVar8 != TDEFL_STATUS_DONE) {
            (*pZip->m_pFree)(pZip->m_pAlloc_opaque,local_c8);
            return 0;
          }
          local_d0 = state.m_cur_archive_file_ofs;
          mVar17 = 8;
          pvVar21 = (void *)state.m_comp_size;
        }
      }
      else {
        pvVar21 = pvVar20;
        pvVar11 = (void *)(*pZip->m_pWrite)(pZip->m_pIO_opaque,local_d0,local_a0,(size_t)pvVar20);
        if (pvVar11 != pvVar20) goto LAB_0010cb33;
        local_d0 = local_d0 + (long)pvVar21;
        mVar17 = (mz_uint64)(uVar16 >> 7);
      }
      (*pZip->m_pFree)(pZip->m_pAlloc_opaque,local_c8);
      mVar4 = dos_time;
      method = dos_date;
      if ((ulong)pvVar21 >> 0x20 != 0) {
        return 0;
      }
      if (local_d0 >> 0x20 == 0) {
        mVar14 = local_b8 + local_90;
        uVar6 = 0x14;
        if ((short)mVar17 == 0) {
          uVar6 = 0;
        }
        cur_time = (time_t)CONCAT14(uVar6,0x4034b50);
        uStack_80 = (undefined1)mVar17;
        uStack_7f = 0;
        uStack_7e = (undefined1)dos_time;
        uStack_7d = (undefined1)(dos_time >> 8);
        uStack_7c = (undefined1)dos_date;
        uStack_7b = (undefined1)(dos_date >> 8);
        uStack_7a = (undefined1)local_a8;
        uStack_79 = (undefined1)(local_a8 >> 8);
        uStack_78 = (undefined1)(local_a8 >> 0x10);
        uStack_77 = (undefined1)(local_a8 >> 0x18);
        uStack_76 = SUB81(pvVar21,0);
        uStack_75 = (undefined1)((ulong)pvVar21 >> 8);
        uStack_74 = (undefined1)((ulong)pvVar21 >> 0x10);
        uStack_73 = (undefined1)((ulong)pvVar21 >> 0x18);
        uStack_72 = (ulong)CONCAT15((char)(local_c0 >> 8),CONCAT14((char)local_c0,(int)local_98));
        dos_date_00 = 0xcd39;
        sVar10 = (*pZip->m_pWrite)(pZip->m_pIO_opaque,mVar14,&cur_time,0x1e);
        if (sVar10 == 0x1e) {
          mVar7 = (anonymous_namespace)::miniz::mz_zip_writer_add_to_central_dir
                            (pZip,local_b0,(mz_uint16)local_c0,local_58,(mz_uint16)local_60,local_98
                             ,(mz_uint16)pvVar21,local_a8,mVar17,(uint)mVar4,method,
                             (mz_uint16)mVar14,(mz_uint16)local_68,dos_date_00,
                             CONCAT17(bVar15,in_stack_ffffffffffffff18),(mz_uint32)pvVar21);
          if (mVar7 != 0) {
            pZip->m_total_files = pZip->m_total_files + 1;
            pZip->m_archive_size = local_d0;
            return 1;
          }
          return 0;
        }
        return 0;
      }
      return 0;
    }
  }
LAB_0010cb33:
  (*pZip->m_pFree)(pZip->m_pAlloc_opaque,local_c8);
  return 0;
}

Assistant:

mz_bool mz_zip_writer_add_mem_ex(mz_zip_archive *pZip,
                                 const char *pArchive_name, const void *pBuf,
                                 size_t buf_size, const void *pComment,
                                 mz_uint16 comment_size,
                                 mz_uint level_and_flags, mz_uint64 uncomp_size,
                                 mz_uint32 uncomp_crc32) {
  mz_uint16 method = 0, dos_time = 0, dos_date = 0;
  mz_uint level, ext_attributes = 0, num_alignment_padding_bytes;
  mz_uint64 local_dir_header_ofs = pZip->m_archive_size,
            cur_archive_file_ofs = pZip->m_archive_size, comp_size = 0;
  size_t archive_name_size;
  mz_uint8 local_dir_header[MZ_ZIP_LOCAL_DIR_HEADER_SIZE];
  tdefl_compressor *pComp = NULL;
  mz_bool store_data_uncompressed;
  mz_zip_internal_state *pState;

  if ((int)level_and_flags < 0)
    level_and_flags = MZ_DEFAULT_LEVEL;
  level = level_and_flags & 0xF;
  store_data_uncompressed =
      ((!level) || (level_and_flags & MZ_ZIP_FLAG_COMPRESSED_DATA));

  if ((!pZip) || (!pZip->m_pState) ||
      (pZip->m_zip_mode != MZ_ZIP_MODE_WRITING) || ((buf_size) && (!pBuf)) ||
      (!pArchive_name) || ((comment_size) && (!pComment)) ||
      (pZip->m_total_files == 0xFFFF) || (level > MZ_UBER_COMPRESSION))
    return MZ_FALSE;

  pState = pZip->m_pState;

  if ((!(level_and_flags & MZ_ZIP_FLAG_COMPRESSED_DATA)) && (uncomp_size))
    return MZ_FALSE;
  // No zip64 support yet
  if ((buf_size > 0xFFFFFFFF) || (uncomp_size > 0xFFFFFFFF))
    return MZ_FALSE;
  if (!mz_zip_writer_validate_archive_name(pArchive_name))
    return MZ_FALSE;

#ifndef MINIZ_NO_TIME
  {
    time_t cur_time;
    time(&cur_time);
    mz_zip_time_to_dos_time(cur_time, &dos_time, &dos_date);
  }
#endif // #ifndef MINIZ_NO_TIME

  archive_name_size = strlen(pArchive_name);
  if (archive_name_size > 0xFFFF)
    return MZ_FALSE;

  num_alignment_padding_bytes =
      mz_zip_writer_compute_padding_needed_for_file_alignment(pZip);

  // no zip64 support yet
  if ((pZip->m_total_files == 0xFFFF) ||
      ((pZip->m_archive_size + num_alignment_padding_bytes +
        MZ_ZIP_LOCAL_DIR_HEADER_SIZE + MZ_ZIP_CENTRAL_DIR_HEADER_SIZE +
        comment_size + archive_name_size) > 0xFFFFFFFF))
    return MZ_FALSE;

  if ((archive_name_size) && (pArchive_name[archive_name_size - 1] == '/')) {
    // Set DOS Subdirectory attribute bit.
    ext_attributes |= 0x10;
    // Subdirectories cannot contain data.
    if ((buf_size) || (uncomp_size))
      return MZ_FALSE;
  }

  // Try to do any allocations before writing to the archive, so if an
  // allocation fails the file remains unmodified. (A good idea if we're doing
  // an in-place modification.)
  if ((!mz_zip_array_ensure_room(pZip, &pState->m_central_dir,
                                 MZ_ZIP_CENTRAL_DIR_HEADER_SIZE +
                                     archive_name_size + comment_size)) ||
      (!mz_zip_array_ensure_room(pZip, &pState->m_central_dir_offsets, 1)))
    return MZ_FALSE;

  if ((!store_data_uncompressed) && (buf_size)) {
    if (NULL == (pComp = (tdefl_compressor *)pZip->m_pAlloc(
                     pZip->m_pAlloc_opaque, 1, sizeof(tdefl_compressor))))
      return MZ_FALSE;
  }

  if (!mz_zip_writer_write_zeros(pZip, cur_archive_file_ofs,
                                 num_alignment_padding_bytes +
                                     sizeof(local_dir_header))) {
    pZip->m_pFree(pZip->m_pAlloc_opaque, pComp);
    return MZ_FALSE;
  }
  local_dir_header_ofs += num_alignment_padding_bytes;
  if (pZip->m_file_offset_alignment) {
    MZ_ASSERT((local_dir_header_ofs & (pZip->m_file_offset_alignment - 1)) ==
              0);
  }
  cur_archive_file_ofs +=
      num_alignment_padding_bytes + sizeof(local_dir_header);

  MZ_CLEAR_OBJ(local_dir_header);
  if (pZip->m_pWrite(pZip->m_pIO_opaque, cur_archive_file_ofs, pArchive_name,
                     archive_name_size) != archive_name_size) {
    pZip->m_pFree(pZip->m_pAlloc_opaque, pComp);
    return MZ_FALSE;
  }
  cur_archive_file_ofs += archive_name_size;

  if (!(level_and_flags & MZ_ZIP_FLAG_COMPRESSED_DATA)) {
    uncomp_crc32 =
        (mz_uint32)mz_crc32(MZ_CRC32_INIT, (const mz_uint8 *)pBuf, buf_size);
    uncomp_size = buf_size;
    if (uncomp_size <= 3) {
      level = 0;
      store_data_uncompressed = MZ_TRUE;
    }
  }

  if (store_data_uncompressed) {
    if (pZip->m_pWrite(pZip->m_pIO_opaque, cur_archive_file_ofs, pBuf,
                       buf_size) != buf_size) {
      pZip->m_pFree(pZip->m_pAlloc_opaque, pComp);
      return MZ_FALSE;
    }

    cur_archive_file_ofs += buf_size;
    comp_size = buf_size;

    if (level_and_flags & MZ_ZIP_FLAG_COMPRESSED_DATA)
      method = MZ_DEFLATED;
  } else if (buf_size) {
    mz_zip_writer_add_state state;

    state.m_pZip = pZip;
    state.m_cur_archive_file_ofs = cur_archive_file_ofs;
    state.m_comp_size = 0;

    if ((tdefl_init(pComp, mz_zip_writer_add_put_buf_callback, &state,
                    tdefl_create_comp_flags_from_zip_params(
                        level, -15, MZ_DEFAULT_STRATEGY)) !=
         TDEFL_STATUS_OKAY) ||
        (tdefl_compress_buffer(pComp, pBuf, buf_size, TDEFL_FINISH) !=
         TDEFL_STATUS_DONE)) {
      pZip->m_pFree(pZip->m_pAlloc_opaque, pComp);
      return MZ_FALSE;
    }

    comp_size = state.m_comp_size;
    cur_archive_file_ofs = state.m_cur_archive_file_ofs;

    method = MZ_DEFLATED;
  }

  pZip->m_pFree(pZip->m_pAlloc_opaque, pComp);
  pComp = NULL;

  // no zip64 support yet
  if ((comp_size > 0xFFFFFFFF) || (cur_archive_file_ofs > 0xFFFFFFFF))
    return MZ_FALSE;

  if (!mz_zip_writer_create_local_dir_header(
          pZip, local_dir_header, (mz_uint16)archive_name_size, 0, uncomp_size,
          comp_size, uncomp_crc32, method, 0, dos_time, dos_date))
    return MZ_FALSE;

  if (pZip->m_pWrite(pZip->m_pIO_opaque, local_dir_header_ofs, local_dir_header,
                     sizeof(local_dir_header)) != sizeof(local_dir_header))
    return MZ_FALSE;

  if (!mz_zip_writer_add_to_central_dir(
          pZip, pArchive_name, (mz_uint16)archive_name_size, NULL, 0, pComment,
          comment_size, uncomp_size, comp_size, uncomp_crc32, method, 0,
          dos_time, dos_date, local_dir_header_ofs, ext_attributes))
    return MZ_FALSE;

  pZip->m_total_files++;
  pZip->m_archive_size = cur_archive_file_ofs;

  return MZ_TRUE;
}